

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_service.cc
# Opt level: O1

ps_err_e ps_lstop(ps_prochandle *ph,lwpid_t lwpid)

{
  (**(code **)(*(long *)ph + 0x28))();
  return PS_OK;
}

Assistant:

ps_err_e ps_lstop(const struct ps_prochandle *ph, lwpid_t lwpid)
{
    Process *p = const_cast<Process *>(static_cast<const Process *>(ph));
    try {
        p->stop(lwpid);
        return PS_OK;
    }
    catch (...) {
        return PS_ERR;
    }
}